

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,WriteStream *w)

{
  CodePrinter *this_00;
  string *s;
  Expression *e;
  
  this_00 = choc::text::CodePrinter::operator<<(this->out,"write ");
  s = Identifier::toString_abi_cxx11_(&(((w->target).object)->super_IODeclaration).name);
  choc::text::CodePrinter::operator<<(this_00,s);
  if ((w->element).object != (Expression *)0x0) {
    choc::text::CodePrinter::operator<<(this->out,'[');
    e = pool_ptr<soul::heart::Expression>::operator*(&w->element);
    printExpression(this,e);
    choc::text::CodePrinter::operator<<(this->out,']');
  }
  choc::text::CodePrinter::operator<<(this->out,' ');
  printExpression(this,(w->value).object);
  return;
}

Assistant:

void printDescription (const heart::WriteStream& w)
        {
            out << "write " << w.target->name.toString();

            if (w.element != nullptr)
            {
                out << '[';
                printExpression (*w.element);
                out << ']';
            }

            out << ' ';
            printExpression (w.value);
        }